

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

LocalSet * __thiscall wasm::Builder::makeLocalSet(Builder *this,Index index,Expression *value)

{
  LocalSet *pLVar1;
  
  pLVar1 = (LocalSet *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
  pLVar1->index = index;
  pLVar1->value = value;
  ::wasm::LocalSet::makeSet();
  ::wasm::LocalSet::finalize();
  return pLVar1;
}

Assistant:

LocalSet* makeLocalSet(Index index, Expression* value) {
    auto* ret = wasm.allocator.alloc<LocalSet>();
    ret->index = index;
    ret->value = value;
    ret->makeSet();
    ret->finalize();
    return ret;
  }